

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckTH(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  Bool BVar2;
  uint uVar3;
  ctmbstr str;
  char cVar4;
  ctmbstr cp;
  char *pcVar5;
  ctmbstr cp_1;
  ctmbstr ptVar6;
  AttVal *pAVar7;
  
  if ((doc->access).PRIORITYCHK == 3) {
    pAVar7 = node->attributes;
    if (pAVar7 == (AttVal *)0x0) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
      do {
        if ((pAVar7->dict != (Attribute *)0x0) && (pAVar7->dict->id == TidyAttr_ABBR)) {
          pcVar5 = pAVar7->value;
          if (pcVar5 != (char *)0x0) {
            do {
              if (*pcVar5 == '\0') goto LAB_0015395a;
              BVar2 = prvTidyIsWhite((int)*pcVar5);
              pcVar5 = pcVar5 + 1;
            } while (BVar2 != no);
            bVar1 = true;
          }
LAB_0015395a:
          if ((pAVar7->value == (ctmbstr)0x0) ||
             (uVar3 = prvTidytmbstrlen(pAVar7->value), uVar3 == 0)) {
            prvTidyReportAccessError(doc,node,0x2cf);
            bVar1 = true;
          }
          pcVar5 = pAVar7->value;
          if ((pcVar5 != (char *)0x0) && (cVar4 = *pcVar5, cVar4 != '\0')) {
            do {
              pcVar5 = pcVar5 + 1;
              BVar2 = prvTidyIsWhite((int)cVar4);
              if (BVar2 == no) goto LAB_001539d3;
              cVar4 = *pcVar5;
            } while (cVar4 != '\0');
            if (BVar2 != yes) goto LAB_001539d3;
          }
          uVar3 = prvTidytmbstrlen(pAVar7->value);
          if (uVar3 != 0) {
            prvTidyReportAccessError(doc,node,0x2d0);
            bVar1 = true;
          }
        }
LAB_001539d3:
        pAVar7 = pAVar7->next;
      } while (pAVar7 != (AttVal *)0x0);
      bVar1 = !bVar1;
    }
    str = textFromOneNode(doc,node->content);
    ptVar6 = str;
    do {
      cVar4 = *ptVar6;
      if (cVar4 == '\0') {
        return;
      }
      BVar2 = prvTidyIsWhite((int)cVar4);
      ptVar6 = ptVar6 + 1;
    } while (BVar2 != no);
    if ((cVar4 != '\0') && (uVar3 = prvTidytmbstrlen(str), (bool)(0xf < uVar3 & bVar1))) {
      prvTidyReportAccessError(doc,node,0x2ce);
      return;
    }
  }
  return;
}

Assistant:

static void CheckTH( TidyDocImpl* doc, Node* node )
{
    Bool HasAbbr = no;
    ctmbstr word = NULL;
    AttVal* av;

    if (Level3_Enabled( doc ))
    {
        /* Checks TH element for 'ABBR' attribute */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            if ( attrIsABBR(av) )
            {
                /* Value must not be NULL and must be less than 15 characters */
                if ((av->value != NULL)&&
                    (IsWhitespace (av->value) == no))
                {
                    HasAbbr = yes;
                }

                if ((av->value == NULL)||
                    (TY_(tmbstrlen)(av->value) == 0))
                {
                    HasAbbr = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_MAY_REQUIRE_HEADER_ABBR_NULL);
                }
                
                if ((IsWhitespace (av->value) == yes)&&
                    (TY_(tmbstrlen)(av->value) > 0))
                {
                    HasAbbr = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_MAY_REQUIRE_HEADER_ABBR_SPACES);
                }
            }
        }

        /* If the header is greater than 15 characters, an abbreviation is needed */
        word = textFromOneNode( doc, node->content);

        if ((word != NULL)&&
            (IsWhitespace (word) == no))
        {
            /* Must have 'ABBR' attribute if header is > 15 characters */
            if ((TY_(tmbstrlen)(word) > 15)&&
                (HasAbbr == no))
            {
                TY_(ReportAccessError)( doc, node, TABLE_MAY_REQUIRE_HEADER_ABBR);
            }
        }
    }
}